

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

void tb_add_jump(TranslationBlock *tb,int n,TranslationBlock *tb_next)

{
  uintptr_t uVar1;
  bool bVar2;
  uintptr_t local_38;
  uintptr_t _old;
  uintptr_t old;
  TranslationBlock *tb_next_local;
  int n_local;
  TranslationBlock *tb_local;
  
  if ((uint)n < 2) {
    if ((tb_next->flags & 0x40000) == 0) {
      local_38 = 0;
      LOCK();
      uVar1 = tb->jmp_list_next[(long)n + 1];
      bVar2 = uVar1 == 0;
      if (bVar2) {
        tb->jmp_list_next[(long)n + 1] = (uintptr_t)tb_next;
        uVar1 = 0;
      }
      UNLOCK();
      if (!bVar2) {
        local_38 = uVar1;
      }
      if (local_38 == 0) {
        uVar1._0_4_ = tb_next->cflags;
        uVar1._4_4_ = tb_next->trace_vcpu_dstate;
        tb_set_jmp_target_tricore(tb,n,uVar1);
        tb->jmp_list_next[(long)n + -1] = tb_next->jmp_target_arg[1];
        tb_next->jmp_target_arg[1] = (ulong)tb | (long)n;
      }
    }
    return;
  }
  __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
}

Assistant:

static inline void tb_add_jump(TranslationBlock *tb, int n,
                               TranslationBlock *tb_next)
{
    uintptr_t old;

    assert(n < ARRAY_SIZE(tb->jmp_list_next));

    /* make sure the destination TB is valid */
    if (tb_next->cflags & CF_INVALID) {
        goto out_unlock_next;
    }
    /* Atomically claim the jump destination slot only if it was NULL */
#ifdef _MSC_VER
    old = atomic_cmpxchg((long *)&tb->jmp_dest[n], (uintptr_t)NULL, (uintptr_t)tb_next);
#else
    old = atomic_cmpxchg(&tb->jmp_dest[n], (uintptr_t)NULL, (uintptr_t)tb_next);
#endif
    if (old) {
        goto out_unlock_next;
    }

    /* patch the native jump address */
    tb_set_jmp_target(tb, n, (uintptr_t)tb_next->tc.ptr);

    /* add in TB jmp list */
    tb->jmp_list_next[n] = tb_next->jmp_list_head;
    tb_next->jmp_list_head = (uintptr_t)tb | n;

    return;

 out_unlock_next:
    return;
}